

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkfc(fitsfile *fptr,char *keyname,float *value,int decim,char *comm,int *status)

{
  char *cval;
  size_t sVar1;
  size_t sVar2;
  undefined4 in_ECX;
  char *in_R8;
  int *in_R9;
  char card [81];
  char tmpstring [71];
  char valstring [71];
  int *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  char local_88 [64];
  int *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*in_R9 < 1) {
    strcpy(local_88,"(");
    ffr2f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
          in_stack_fffffffffffffeb8);
    cval = (char *)strlen(local_88);
    sVar1 = strlen(&stack0xffffffffffffff28);
    if (cval + sVar1 + 2 < (char *)0x47) {
      strcat(local_88,&stack0xffffffffffffff28);
      strcat(local_88,", ");
      ffr2f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,cval,in_stack_fffffffffffffeb8);
      sVar1 = strlen(local_88);
      sVar2 = strlen(&stack0xffffffffffffff28);
      if (sVar1 + sVar2 + 1 < 0x47) {
        strcat(local_88,&stack0xffffffffffffff28);
        strcat(local_88,")");
        ffmkky((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,(char *)in_R9,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        ffprec(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        local_4 = *in_R9;
      }
      else {
        ffpmsg((char *)0x23d714);
        *in_R9 = 0x192;
        local_4 = 0x192;
      }
    }
    else {
      ffpmsg((char *)0x23d66f);
      *in_R9 = 0x192;
      local_4 = 0x192;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffpkfc( fitsfile *fptr,      /* I - FITS file pointer                   */
            const char  *keyname,/* I - name of keyword to write            */
            float *value,        /* I - keyword value (real, imaginary)     */
            int   decim,         /* I - number of decimal places to display */
            const char  *comm,   /* I - keyword comment                     */
            int   *status)       /* IO - error status                       */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Writes an complex float keyword value. Format = (realvalue, imagvalue)
*/
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring, "(" );
    ffr2f(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring)+strlen(tmpstring)+2 > FLEN_VALUE-1)
    {
       ffpmsg("Error converting complex to string (ffpkfc)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffr2f(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring)+strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("Error converting complex to string (ffpkfc)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}